

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QRect __thiscall QPolygon::boundingRect(QPolygon *this)

{
  int iVar1;
  long lVar2;
  QPoint *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QPoint *pQVar9;
  int iVar10;
  QRect QVar11;
  
  lVar2 = (this->super_QList<QPoint>).d.size;
  if (lVar2 == 0) {
    iVar6 = -1;
    iVar8 = -1;
    iVar5 = 0;
    iVar7 = 0;
  }
  else {
    pQVar3 = (this->super_QList<QPoint>).d.ptr;
    iVar6 = (pQVar3->xp).m_i;
    iVar8 = (pQVar3->yp).m_i;
    iVar5 = iVar6;
    iVar7 = iVar8;
    if (lVar2 != 1) {
      pQVar9 = pQVar3 + 1;
      do {
        iVar10 = (pQVar9->xp).m_i;
        iVar1 = (pQVar9->yp).m_i;
        iVar4 = iVar6;
        if (iVar6 < iVar10) {
          iVar4 = iVar10;
        }
        if (iVar5 <= iVar10) {
          iVar6 = iVar4;
          iVar10 = iVar5;
        }
        iVar5 = iVar10;
        iVar10 = iVar8;
        if (iVar8 < iVar1) {
          iVar10 = iVar1;
        }
        if (iVar7 <= iVar1) {
          iVar1 = iVar7;
          iVar8 = iVar10;
        }
        iVar7 = iVar1;
        pQVar9 = pQVar9 + 1;
      } while (pQVar9 != pQVar3 + lVar2);
    }
  }
  QVar11.y1.m_i = iVar7;
  QVar11.x1.m_i = iVar5;
  QVar11.y2.m_i = iVar8;
  QVar11.x2.m_i = iVar6;
  return QVar11;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }